

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O0

uint32 __thiscall
google::protobuf::internal::ReflectionSchema::HasBitsOffset(ReflectionSchema *this)

{
  bool bVar1;
  LogMessage *other;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  ReflectionSchema *local_10;
  ReflectionSchema *this_local;
  
  local_10 = this;
  bVar1 = HasHasbits(this);
  local_49 = 0;
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.h"
               ,0xa6);
    local_49 = 1;
    other = LogMessage::operator<<(&local_48,"CHECK failed: HasHasbits(): ");
    LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    LogMessage::~LogMessage(&local_48);
  }
  return this->has_bits_offset_;
}

Assistant:

uint32 HasBitsOffset() const {
    GOOGLE_DCHECK(HasHasbits());
    return has_bits_offset_;
  }